

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardDemodulation.cpp
# Opt level: O1

BwSimplificationRecord __thiscall
Inferences::BackwardDemodulation::ResultFn::operator()
          (ResultFn *this,
          pair<Kernel::TermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
          *arg)

{
  Literal ***pppLVar1;
  ResultSubstitution *pRVar2;
  RefCounter *pRVar3;
  TermLiteralClause *pTVar4;
  undefined8 uVar5;
  TermList lhs;
  TermList rwTerm;
  Ordering *pOVar6;
  Self SVar7;
  _func_int **pp_Var8;
  bool bVar9;
  int iVar10;
  void **head;
  Entry *pEVar11;
  TermList TVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Literal *pLVar13;
  Clause *unit;
  InferenceExtra *extra;
  ulong uVar14;
  ulong uVar15;
  Clause *pCVar16;
  BwSimplificationRecord BVar17;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause> qr;
  SmartPtr<Indexing::ResultSubstitution> subs;
  RStack<Literal_*> resLits;
  Applicator appl;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_d0;
  _func_int **local_c0;
  uint64_t local_b8;
  byte bStack_b0;
  SubstApplicator *local_a8;
  uint64_t local_a0;
  uint uStack_98;
  undefined8 local_90;
  SubstApplicator local_88;
  ResultSubstitution *local_80;
  SimplifyingInference2 local_78;
  Inference local_60;
  
  pRVar2 = (arg->second).unifier._obj;
  pRVar3 = (arg->second).unifier._refCnt;
  if (pRVar3 != (RefCounter *)0x0 && pRVar2 != (ResultSubstitution *)0x0) {
    pRVar3->_val = pRVar3->_val + 1;
  }
  pTVar4 = (arg->second).data;
  pCVar16 = this->_cl;
  if ((~*(uint *)&pCVar16->field_0x38 & 0x300000) == 0) {
    Kernel::Clause::computeColor(pCVar16);
  }
  uVar5 = *(undefined8 *)&pCVar16->field_0x38;
  pCVar16 = pTVar4->clause;
  if ((~*(uint *)&pCVar16->field_0x38 & 0x300000) == 0) {
    Kernel::Clause::computeColor(pCVar16);
  }
  if (((~((uint)uVar5 | *(uint *)&pCVar16->field_0x38) & 0x300000) != 0) &&
     (this->_cl != pTVar4->clause)) {
    pEVar11 = ::Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::findEntry
                        ((this->_removed)._obj,pTVar4->clause);
    if (pEVar11 == (Entry *)0x0) {
      lhs._content = (arg->first)._content;
      TVar12 = Kernel::EqHelper::getOtherEqualitySide(this->_eqLit,lhs);
      if (pRVar3 != (RefCounter *)0x0 && pRVar2 != (ResultSubstitution *)0x0) {
        pRVar3->_val = pRVar3->_val + 1;
      }
      local_88._vptr_SubstApplicator = (_func_int **)&PTR__SubstApplicator_00b63018;
      rwTerm._content = (pTVar4->term).super_TermList._content;
      pOVar6 = this->_ordering;
      uStack_98 = uStack_98 & 0xffffff00;
      local_90 = 0;
      local_b8 = TVar12._content;
      local_a0 = rwTerm._content;
      local_80 = pRVar2;
      if ((TVar12._content & 1) != 0) {
        iVar10 = (*pRVar2->_vptr_ResultSubstitution[0x12])
                           (pRVar2,(ulong)((uint)TVar12._content & 0xfffffffd));
        local_b8 = CONCAT44(extraout_var,iVar10);
      }
      bStack_b0 = (byte)(TVar12._content & 1) ^ 1;
      local_a8 = &local_88;
      iVar10 = (*pOVar6->_vptr_Ordering[5])(pOVar6);
      if (iVar10 == 1) {
        TVar12._content._0_4_ = (*pRVar2->_vptr_ResultSubstitution[0x12])(pRVar2,TVar12._content);
        TVar12._content._4_4_ = extraout_var_00;
        bVar9 = DemodulationHelper::redundancyCheckNeededForPremise
                          (this->_helper,pTVar4->clause,pTVar4->literal,rwTerm);
        if (bVar9) {
          bVar9 = DemodulationHelper::isPremiseRedundant
                            (this->_helper,pTVar4->clause,pTVar4->literal,rwTerm,TVar12,lhs,
                             &local_88);
          if (!bVar9) goto LAB_004b73db;
        }
        pLVar13 = Kernel::EqHelper::replace(pTVar4->literal,rwTerm,TVar12);
        if ((((pLVar13->super_Term)._functor == 0) &&
            (((pLVar13->super_Term)._args[0]._content & 4) != 0)) &&
           (uVar14 = (ulong)(*(uint *)&(pLVar13->super_Term).field_0xc & 0xfffffff),
           (pLVar13->super_Term)._args[uVar14]._content ==
           (pLVar13->super_Term)._args[uVar14 - 1]._content)) {
          *(int *)(DAT_00b7e1c0 + 0x154) = *(int *)(DAT_00b7e1c0 + 0x154) + 1;
          ::Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                    ((this->_removed)._obj,pTVar4->clause,1);
          pCVar16 = pTVar4->clause;
          unit = (Clause *)0x0;
        }
        else {
          uVar14 = *(ulong *)&pTVar4->clause->field_0x38;
          ::Lib::
          Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
          Recycled(&local_d0);
          SVar7._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
               (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                  )local_d0._self;
          local_c0 = (_func_int **)lhs._content;
          if (*(Literal ***)
               ((long)local_d0._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
               0x10) == *(Literal ***)
                         ((long)local_d0._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x18)) {
            ::Lib::Stack<Kernel::Literal_*>::expand
                      ((Stack<Kernel::Literal_*> *)
                       local_d0._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
          }
          **(Literal ***)
            ((long)SVar7._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
            0x10) = pLVar13;
          pppLVar1 = (Literal ***)
                     ((long)SVar7._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                            _M_head_impl + 0x10);
          *pppLVar1 = *pppLVar1 + 1;
          uVar14 = uVar14 & 0xfffff;
          if (uVar14 != 0) {
            uVar15 = 0;
            do {
              SVar7._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                   local_d0._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
              pLVar13 = pTVar4->clause->_literals[uVar15];
              if (pLVar13 != pTVar4->literal) {
                if (*(Literal ***)
                     ((long)local_d0._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                            _M_head_impl + 0x10) ==
                    *(Literal ***)
                     ((long)local_d0._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                            _M_head_impl + 0x18)) {
                  ::Lib::Stack<Kernel::Literal_*>::expand
                            ((Stack<Kernel::Literal_*> *)
                             local_d0._self._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                             _M_head_impl);
                }
                **(Literal ***)
                  ((long)SVar7._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                  + 0x10) = pLVar13;
                pppLVar1 = (Literal ***)
                           ((long)SVar7._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                  _M_head_impl + 0x10);
                *pppLVar1 = *pppLVar1 + 1;
              }
              uVar15 = uVar15 + 1;
            } while (uVar14 != uVar15);
          }
          *(int *)(DAT_00b7e1c0 + 0x150) = *(int *)(DAT_00b7e1c0 + 0x150) + 1;
          ::Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                    ((this->_removed)._obj,pTVar4->clause,1);
          local_78.premise1 = pTVar4->clause;
          local_78.premise2 = this->_cl;
          local_78.rule = BACKWARD_DEMODULATION;
          Kernel::Inference::Inference(&local_60,&local_78);
          pp_Var8 = local_c0;
          unit = Kernel::Clause::fromStack
                           ((Stack<Kernel::Literal_*> *)
                            local_d0._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                            _M_head_impl,&local_60);
          if (*(int *)(::Lib::env + 0x85a8) == 2) {
            extra = (InferenceExtra *)::operator_new(0x18);
            extra->_vptr_InferenceExtra = (_func_int **)&PTR__InferenceExtra_00b66580;
            extra[1]._vptr_InferenceExtra = pp_Var8;
            extra[2]._vptr_InferenceExtra = (_func_int **)rwTerm._content;
            ::Lib::ProofExtra::insert((ProofExtra *)&DAT_00b7e1d8,&unit->super_Unit,extra);
          }
          pCVar16 = pTVar4->clause;
          ::Lib::
          Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
          ~Recycled(&local_d0);
        }
      }
      else {
LAB_004b73db:
        unit = (Clause *)0x0;
        pCVar16 = (Clause *)0x0;
      }
      if (((pRVar2 != (ResultSubstitution *)0x0) && (pRVar3 != (RefCounter *)0x0)) &&
         (pRVar3->_val = pRVar3->_val + -1, pRVar3->_val == 0)) {
        (*pRVar2->_vptr_ResultSubstitution[1])();
        if (pRVar3 != (RefCounter *)0x0) {
          *(undefined8 *)pRVar3 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar3;
        }
      }
      goto LAB_004b71c9;
    }
  }
  unit = (Clause *)0x0;
  pCVar16 = (Clause *)0x0;
LAB_004b71c9:
  if (((pRVar2 != (ResultSubstitution *)0x0) && (pRVar3 != (RefCounter *)0x0)) &&
     (pRVar3->_val = pRVar3->_val + -1, pRVar3->_val == 0)) {
    (*pRVar2->_vptr_ResultSubstitution[1])();
    if (pRVar3 != (RefCounter *)0x0) {
      *(undefined8 *)pRVar3 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar3;
    }
  }
  BVar17.replacement = unit;
  BVar17.toRemove = pCVar16;
  return BVar17;
}

Assistant:

BwSimplificationRecord operator() (pair<TermList,QueryRes<ResultSubstitutionSP, TermLiteralClause>> arg)
  {
    auto qr=arg.second;

    if( !ColorHelper::compatible(_cl->color(), qr.data->clause->color()) ) {
      //colors of premises don't match
      return BwSimplificationRecord(0);
    }

    if(_cl==qr.data->clause || _removed->find(qr.data->clause)) {
      //the retreived clause was already replaced during this
      //backward demodulation
      return BwSimplificationRecord(0);
    }

    TermList lhs=arg.first;
    TermList rhs=EqHelper::getOtherEqualitySide(_eqLit, lhs);

    // AYB there used to be a check here to ensure that the sorts
    // matched. This is no longer necessary, as sort matching / unification
    // is handled directly within the tree

    auto subs = qr.unifier;
    ASS(subs->isIdentityOnResultWhenQueryBound());

    Applicator appl(subs.ptr());

    TermList lhsS=qr.data->term;

    if (_ordering.compareUnidirectional(AppliedTerm(lhsS), AppliedTerm(rhs,&appl,true))!=Ordering::GREATER) {
      return BwSimplificationRecord(0);
    }

    TermList rhsS=subs->applyToBoundQuery(rhs);

    if (_helper.redundancyCheckNeededForPremise(qr.data->clause,qr.data->literal,lhsS) &&
      !_helper.isPremiseRedundant(qr.data->clause,qr.data->literal,lhsS,rhsS,lhs,&appl))
    {
      return BwSimplificationRecord(0);
    }

    Literal* resLit=EqHelper::replace(qr.data->literal,lhsS,rhsS);
    if(EqHelper::isEqTautology(resLit)) {
      env.statistics->backwardDemodulationsToEqTaut++;
      _removed->insert(qr.data->clause);
      return BwSimplificationRecord(qr.data->clause);
    }

    unsigned cLen=qr.data->clause->length();
    RStack<Literal*> resLits;

    resLits->push(resLit);

    for(unsigned i=0;i<cLen;i++) {
      Literal* curr=(*qr.data->clause)[i];
      if(curr!=qr.data->literal) {
        resLits->push(curr);
      }
    }

    env.statistics->backwardDemodulations++;
    _removed->insert(qr.data->clause);
    Clause *replacement = Clause::fromStack(
      *resLits,
      SimplifyingInference2(InferenceRule::BACKWARD_DEMODULATION, qr.data->clause, _cl)
    );
    if(env.options->proofExtra() == Options::ProofExtra::FULL)
      env.proofExtra.insert(replacement, new BackwardDemodulationExtra(lhs, lhsS));
    return BwSimplificationRecord(qr.data->clause, replacement);
  }